

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmfilelockmgr.cpp
# Opt level: O0

void __thiscall
CorUnix::CSharedMemoryFileTransactionLock::ReleaseLock(CSharedMemoryFileTransactionLock *this)

{
  CSharedMemoryFileTransactionLock *this_local;
  
  FILEUnlockFileRegion
            (this->m_shmFileLocks,this->m_pvControllerInstance,this->m_lockRgnStart,
             this->m_nbBytesToLock,RDWR_LOCK_RGN);
  InternalDelete<CorUnix::CSharedMemoryFileTransactionLock>(this);
  return;
}

Assistant:

void
CSharedMemoryFileTransactionLock::ReleaseLock()
{
    FILEUnlockFileRegion(
        m_shmFileLocks,
        m_pvControllerInstance,
        m_lockRgnStart, 
        m_nbBytesToLock,
        RDWR_LOCK_RGN
        );

    InternalDelete(this);
}